

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallCommand.cxx
# Opt level: O0

unique_ptr<cmInstallTargetGenerator,_std::default_delete<cmInstallTargetGenerator>_> __thiscall
anon_unknown.dwarf_3e690d::CreateInstallTargetGenerator
          (anon_unknown_dwarf_3e690d *this,cmTarget *target,cmInstallCommandArguments *args,
          bool impLib,cmListFileBacktrace *backtrace,string *destination,bool forceOpt,bool namelink
          )

{
  string *__args_6;
  string *__args_2;
  cmInstallCommandArguments *this_00;
  bool bVar1;
  cmMakefile *mf;
  string *__args_1;
  string *__args_4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__args_5;
  pointer g_00;
  byte local_89;
  string *local_88;
  undefined1 local_4b;
  bool local_4a [2];
  string *local_48;
  string *component;
  MessageLevel message;
  bool namelink_local;
  bool forceOpt_local;
  string *destination_local;
  cmListFileBacktrace *backtrace_local;
  cmInstallCommandArguments *pcStack_20;
  bool impLib_local;
  cmInstallCommandArguments *args_local;
  cmTarget *target_local;
  __single_object *g;
  
  component._7_1_ = forceOpt;
  component._6_1_ = namelink;
  _message = destination;
  destination_local = (string *)backtrace;
  backtrace_local._7_1_ = impLib;
  pcStack_20 = args;
  args_local = (cmInstallCommandArguments *)target;
  target_local = (cmTarget *)this;
  mf = cmTarget::GetMakefile(target);
  component._0_4_ = cmInstallGenerator::SelectMessageLevel(mf,false);
  cmTarget::SetHaveInstallRule((cmTarget *)args_local,true);
  if ((component._6_1_ & 1) == 0) {
    local_88 = cmInstallCommandArguments::GetComponent_abi_cxx11_(pcStack_20);
  }
  else {
    local_88 = cmInstallCommandArguments::GetNamelinkComponent_abi_cxx11_(pcStack_20);
  }
  local_48 = local_88;
  local_4a[1] = false;
  __args_1 = cmTarget::GetName_abi_cxx11_((cmTarget *)args_local);
  __args_2 = _message;
  __args_4 = cmInstallCommandArguments::GetPermissions_abi_cxx11_(pcStack_20);
  __args_5 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             cmInstallCommandArguments::GetConfigurations_abi_cxx11_(pcStack_20);
  __args_6 = local_48;
  local_4a[0] = cmInstallCommandArguments::GetExcludeFromAll(pcStack_20);
  bVar1 = cmInstallCommandArguments::GetOptional(pcStack_20);
  local_89 = 1;
  if (!bVar1) {
    local_89 = component._7_1_;
  }
  local_4b = local_89 & 1;
  std::
  make_unique<cmInstallTargetGenerator,std::__cxx11::string_const&,std::__cxx11::string_const&,bool&,std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,std::__cxx11::string_const&,cmInstallGenerator::MessageLevel&,bool,bool,cmListFileBacktrace_const&>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,__args_1,
             (bool *)__args_2,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((long)&backtrace_local + 7),
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)__args_4,__args_5,(MessageLevel *)__args_6,(bool *)&component,local_4a,
             (cmListFileBacktrace *)&local_4b);
  this_00 = args_local;
  g_00 = std::unique_ptr<cmInstallTargetGenerator,_std::default_delete<cmInstallTargetGenerator>_>::
         get((unique_ptr<cmInstallTargetGenerator,_std::default_delete<cmInstallTargetGenerator>_> *
             )this);
  cmTarget::AddInstallGenerator((cmTarget *)this_00,g_00);
  return (__uniq_ptr_data<cmInstallTargetGenerator,_std::default_delete<cmInstallTargetGenerator>,_true,_true>
          )(__uniq_ptr_data<cmInstallTargetGenerator,_std::default_delete<cmInstallTargetGenerator>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<cmInstallTargetGenerator> CreateInstallTargetGenerator(
  cmTarget& target, const cmInstallCommandArguments& args, bool impLib,
  cmListFileBacktrace const& backtrace, const std::string& destination,
  bool forceOpt = false, bool namelink = false)
{
  cmInstallGenerator::MessageLevel message =
    cmInstallGenerator::SelectMessageLevel(target.GetMakefile());
  target.SetHaveInstallRule(true);
  const std::string& component =
    namelink ? args.GetNamelinkComponent() : args.GetComponent();
  auto g = cm::make_unique<cmInstallTargetGenerator>(
    target.GetName(), destination, impLib, args.GetPermissions(),
    args.GetConfigurations(), component, message, args.GetExcludeFromAll(),
    args.GetOptional() || forceOpt, backtrace);
  target.AddInstallGenerator(g.get());
  return g;
}